

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

void tonk_socket_destroy(TonkSocket tonkSocket,uint32_t shouldBlock)

{
  int in_ESI;
  long in_RDI;
  ApplicationSession **unaff_retaddr;
  _func_void_ApplicationSession_ptr *in_stack_00000008;
  thread *in_stack_00000010;
  ApplicationSession *session;
  ApplicationSession *in_stack_ffffffffffffffd0;
  
  if (in_RDI != 0) {
    if (in_ESI == 0) {
      std::thread::thread<void(&)(tonk::ApplicationSession*),tonk::ApplicationSession*&,void>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
      std::thread::detach();
      std::thread::~thread((thread *)0x12cdb1);
    }
    else {
      destroy_session(in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

TONK_EXPORT void tonk_socket_destroy(
    TonkSocket tonkSocket, ///< [in] Socket to shutdown
    uint32_t shouldBlock   ///< [in] Boolean: Should this function block?
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (session)
    {
        if (shouldBlock) {
            destroy_session(session);
        }
        else {
            std::thread(destroy_session, session).detach();
        }
    }
}